

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O3

void __thiscall
pstack::Procman::ProcessLocation::ProcessLocation(ProcessLocation *this,Process *proc,Addr address_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CodeLocation *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unsigned_long local_80;
  tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> local_78;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  CodeLocation *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined1 auStack_38 [8];
  sptr dwarf;
  
  (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Process::findSegment(&local_78,proc,address_);
  if (local_78.
      super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
      .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
      super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
      super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    auStack_38 = (undefined1  [8])0x0;
    dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
LAB_001312d7:
    _Var2._M_pi = (this->codeloc).
                  super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_58 = local_78.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
               super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50 = local_78.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
               super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_78.
        super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
        .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
        super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
        super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.
         super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
         .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
         super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
         super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.
                        super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .
                        super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>.
                        _M_head_impl.
                        super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.
         super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
         .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
         super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
         super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.
                        super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .
                        super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>.
                        _M_head_impl.
                        super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Process::getDwarf((Process *)auStack_38,(sptr *)proc);
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (auStack_38 == (undefined1  [8])0x0) goto LAB_001312d7;
    local_80 = address_ -
               local_78.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstack::Procman::CodeLocation,std::allocator<pstack::Procman::CodeLocation>,std::shared_ptr<pstack::Dwarf::Info>&,Elf64_Phdr_const*&,unsigned_long>
              (&_Stack_40,&local_48,
               (allocator<pstack::Procman::CodeLocation> *)
               ((long)&dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7),(shared_ptr<pstack::Dwarf::Info> *)auStack_38,
               (Elf64_Phdr **)&local_78,&local_80);
    _Var2._M_pi = _Stack_40._M_pi;
    pCVar1 = local_48;
    local_48 = (CodeLocation *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->codeloc).
              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pCVar1;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001312ec;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var2._M_pi = _Stack_40._M_pi;
  }
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
LAB_001312ec:
  this->location_ = address_;
  if (dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_78.
      super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
      .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
      super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
      super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
               super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

ProcessLocation::ProcessLocation(Process &proc, Elf::Addr address_) {
    auto [ elfReloc, elf, phdr ] = proc.findSegment(address_);
    auto dwarf = elf ? proc.getDwarf(elf) : nullptr;
    if (dwarf) {
        codeloc = std::make_shared<CodeLocation>(dwarf, phdr, address_ - elfReloc);
    } else {
        codeloc = nullptr;
    }
    location_ = address_;
}